

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::FSSTVector::SetCount(Vector *vector,idx_t count)

{
  VectorBuffer *pVVar1;
  shared_ptr<duckdb::VectorFSSTStringBuffer,_true> sStack_28;
  
  if ((vector->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    make_shared_ptr<duckdb::VectorFSSTStringBuffer>();
    shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorFSSTStringBuffer,_0>
              (&vector->auxiliary,&sStack_28);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.internal.
                super___shared_ptr<duckdb::VectorFSSTStringBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pVVar1 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
  pVVar1[3].aux_data.
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl =
       (VectorAuxiliaryData *)count;
  return;
}

Assistant:

void FSSTVector::SetCount(Vector &vector, idx_t count) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);

	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);

	auto &fsst_string_buffer = vector.auxiliary->Cast<VectorFSSTStringBuffer>();
	fsst_string_buffer.SetCount(count);
}